

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

void __thiscall QFbScreen::setDirty(QFbScreen *this,QRect *rect)

{
  long lVar1;
  QPoint p;
  QFbScreen *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint screenOffset;
  QRect intersection;
  QRect *other;
  QRect local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = &in_RDI->mGeometry;
  QVar2 = QRect::intersected((QRect *)in_RDI,other);
  p = QRect::topLeft(other);
  operator-((QPoint *)in_RDI);
  local_30 = QRect::translated(QVar2._0_8_,(QPoint *)p);
  QRegion::operator+=(&in_RDI->mRepaintRegion,(QRect *)&local_30);
  scheduleUpdate(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::setDirty(const QRect &rect)
{
    const QRect intersection = rect.intersected(mGeometry);
    const QPoint screenOffset = mGeometry.topLeft();
    mRepaintRegion += intersection.translated(-screenOffset); // global to local translation
    scheduleUpdate();
}